

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_connection_upgrade(void)

{
  cio_inet_address *arg1;
  undefined1 local_238 [8];
  cio_http_location target;
  undefined1 local_210 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  
  memcpy(server.keepalive_header + 0x20,&DAT_00124ae8,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90);
  on_header_complete_fake.custom_fake = callback_write_ok_response;
  target.config._4_4_ =
       cio_http_server_init
                 ((cio_http_server *)local_210,&loop,
                  (cio_http_server_configuration *)(server.keepalive_header + 0x20));
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Server initialization failed!",0x6d8,
             UNITY_DISPLAY_STYLE_INT);
  target.config._4_4_ =
       cio_http_location_init
                 ((cio_http_location *)local_238,"/foo",(void *)0x0,alloc_upgrade_handler);
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Request target initialization failed!",0x6dc,
             UNITY_DISPLAY_STYLE_INT);
  target.config._4_4_ =
       cio_http_server_register_location
                 ((cio_http_server *)local_210,(cio_http_location *)local_238);
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Register request target failed!",0x6de,
             UNITY_DISPLAY_STYLE_INT);
  split_request("GET /foo HTTP/1.1\r\nUpgrade: websocket\r\nConnection: Upgrade\r\n\r\n");
  target.config._4_4_ = cio_http_server_serve((cio_http_server *)local_210);
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Serving http failed!",0x6e3,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)serve_error_fake.call_count,"Serve error callback was called!",0x6e5,
             UNITY_DISPLAY_STYLE_INT);
  check_http_response(0x65);
  fire_keepalive_timeout(client_socket);
  return;
}

Assistant:

static void test_connection_upgrade(void)
{
	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = 10,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	on_header_complete_fake.custom_fake = callback_write_ok_response;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_upgrade_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
	err = cio_http_server_register_location(&server, &target);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

	split_request("GET /foo HTTP/1.1" CRLF "Upgrade: websocket" CRLF "Connection: Upgrade" CRLF CRLF);

	err = cio_http_server_serve(&server);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

	TEST_ASSERT_EQUAL_MESSAGE(0, serve_error_fake.call_count, "Serve error callback was called!");
	check_http_response(101);
	fire_keepalive_timeout(client_socket);
}